

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O0

void __thiscall wasm::Fuzzer::Fuzzer(Fuzzer *this,bool verbose)

{
  _Vector_impl local_38;
  undefined1 local_11;
  Fuzzer *pFStack_10;
  bool verbose_local;
  Fuzzer *this_local;
  
  this->verbose = verbose;
  local_11 = verbose;
  pFStack_10 = this;
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->types);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&this->subtypeIndices);
  local_38.super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_38._1_7_ = 0;
  local_38._8_8_ = 0;
  local_38._16_8_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&local_38)
  ;
  Random::Random(&this->rand,(vector<char,_std::allocator<char>_> *)&local_38);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)&local_38);
  return;
}

Assistant:

Fuzzer(bool verbose) : verbose(verbose), rand({}) {}